

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O0

void __thiscall
HostVector_from_std_vector_Test::~HostVector_from_std_vector_Test
          (HostVector_from_std_vector_Test *this)

{
  HostVector_from_std_vector_Test *this_local;
  
  ~HostVector_from_std_vector_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HostVector, from_std_vector) {
    using namespace memory;

    /*
    const std::vector<int> svec{0,1,2,3,4,5,6,7};
    const HostVector<int>::view_type v(const_cast<int*>(svec.data()), 5);
    */

    std::vector<int> v{0,1,2,3,4,5,6,7};
    HostVector<int> hv(v);

    EXPECT_EQ(v.size(), hv.size());
    for(auto i : hv.range()) {
        EXPECT_EQ(v[i], hv[i]);
    }
}